

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroup::MoveToCollection(RowGroup *this,RowGroupCollection *collection_p,idx_t new_start)

{
  pointer psVar1;
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true> *pvVar2;
  ColumnData *pCVar3;
  RowVersionManager *this_00;
  shared_ptr<duckdb::ColumnData,_true> *column;
  pointer this_01;
  optional_ptr<duckdb::RowVersionManager,_true> vinfo;
  optional_ptr<duckdb::RowVersionManager,_true> local_28;
  
  (this->collection)._M_data = collection_p;
  (this->super_SegmentBase<duckdb::RowGroup>).start = new_start;
  pvVar2 = GetColumns(this);
  psVar1 = (pvVar2->
           super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
           ).
           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (pvVar2->
                 super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                 ).
                 super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != psVar1; this_01 = this_01 + 1
      ) {
    pCVar3 = shared_ptr<duckdb::ColumnData,_true>::operator->(this_01);
    (*pCVar3->_vptr_ColumnData[4])(pCVar3,new_start);
  }
  if (((this->deletes_pointers).
       super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       _M_impl.super__Vector_impl_data._M_start ==
       (this->deletes_pointers).
       super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
       _M_impl.super__Vector_impl_data._M_finish) ||
     (((this->deletes_is_loaded)._M_base._M_i & 1U) != 0)) {
    local_28 = GetVersionInfo(this);
    if (local_28.ptr != (RowVersionManager *)0x0) {
      this_00 = optional_ptr<duckdb::RowVersionManager,_true>::operator->(&local_28);
      RowVersionManager::SetStart(this_00,new_start);
    }
  }
  return;
}

Assistant:

void RowGroup::MoveToCollection(RowGroupCollection &collection_p, idx_t new_start) {
	this->collection = collection_p;
	this->start = new_start;
	for (auto &column : GetColumns()) {
		column->SetStart(new_start);
	}
	if (!HasUnloadedDeletes()) {
		auto vinfo = GetVersionInfo();
		if (vinfo) {
			vinfo->SetStart(new_start);
		}
	}
}